

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexSubImage2DParamsCase::createTexture(TexSubImage2DParamsCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  TransferFormat TVar5;
  int iVar6;
  TransferFormat TVar7;
  int iVar8;
  uint rowPitch;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  TransferFormat local_80;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_58;
  
  this_01 = &(this->super_Texture2DSpecCase).m_texFormat;
  TVar7 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  iVar6 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)(((this->super_Texture2DSpecCase).m_width * iVar6 + 3U & 0xfffffffc) *
                              (this->super_Texture2DSpecCase).m_height));
  iVar8 = (this->super_Texture2DSpecCase).m_width;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,this_01,iVar8,(this->super_Texture2DSpecCase).m_height,1,
             iVar8 * iVar6 + 3U & 0xfffffffc,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::fillWithComponentGradients
            (&local_58,&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
             &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,
             (this->super_Texture2DSpecCase).m_width,(this->super_Texture2DSpecCase).m_height,0,
             TVar7.format,TVar7.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar8 = this->m_rowLength;
  if (iVar8 < 1) {
    iVar8 = this->m_subW;
  }
  fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[0];
  fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[1];
  fVar3 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[2];
  fVar4 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[3];
  fVar9 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1;
  fVar10 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2;
  fVar11 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3;
  fVar12 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4;
  rowPitch = (this->m_alignment + iVar8 * iVar6) - 1U & -this->m_alignment;
  colorA.m_data[0] = fVar9 * 1.0 + fVar1;
  colorA.m_data[1] = fVar10 * 0.0 + fVar2;
  colorA.m_data[2] = fVar11 * 0.0 + fVar3;
  colorA.m_data[3] = fVar12 * 1.0 + fVar4;
  colorB.m_data[0] = fVar9 * 0.0 + fVar1;
  colorB.m_data[1] = fVar10 * 1.0 + fVar2;
  colorB.m_data[2] = fVar11 * 0.0 + fVar3;
  colorB.m_data[3] = fVar12 * 1.0 + fVar4;
  local_80 = TVar7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((this->m_skipRows + this->m_subH) * rowPitch));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,this_01,this->m_subW,this->m_subH,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)(this->m_skipPixels * iVar6) + (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid(&local_58,4,&colorA,&colorB);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  TVar5 = local_80;
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glTexSubImage2D
            (this_00,0xde1,0,this->m_subX,this->m_subY,this->m_subW,this->m_subH,TVar5.format,
             TVar7.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		// First fill texture with gradient.
		data.resize(deAlign32(m_width*pixelSize, 4)*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, deAlign32(m_width*pixelSize, 4), 0, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage2D(GL_TEXTURE_2D, 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, &data[0]);
	}